

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueMatrixCase::test(UniformValueMatrixCase *this)

{
  TestContext *pTVar1;
  char *pcVar2;
  bool bVar3;
  deUint32 dVar4;
  RenderContext *renderCtx;
  GLfloat aGStack_258 [2];
  float matrixValues [16];
  GLint location;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  UniformValueMatrixCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  renderCtx = gles2::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  pcVar2 = test::testVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar2,&local_1d1);
  pcVar2 = test::testFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,pcVar2,(allocator<char> *)((long)&location + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&location + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (bVar3) {
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,dVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
    matrixValues[10] = 41.0;
    matrixValues[0xb] = 65.0;
    matrixValues[0xc] = 4.0;
    matrixValues[0xd] = 12.2;
    matrixValues[6] = -55.1;
    matrixValues[7] = 1.1;
    matrixValues[8] = 98.0;
    matrixValues[9] = 19.0;
    matrixValues[2] = 13.0;
    matrixValues[3] = 55.0;
    matrixValues[4] = 12.0;
    matrixValues[5] = 91.0;
    aGStack_258[0] = -1.0;
    aGStack_258[1] = 0.1;
    matrixValues[0] = 4.0;
    matrixValues[1] = 800.0;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    matrixValues[0xf] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"mat2Uniform");
    glu::CallLogWrapper::glUniformMatrix2fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)matrixValues[0xf],1,'\0',
               aGStack_258);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformMatrixValues<2>
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,(GLint)matrixValues[0xf],
               aGStack_258,false);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    matrixValues[0xf] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"mat3Uniform");
    glu::CallLogWrapper::glUniformMatrix3fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)matrixValues[0xf],1,'\0',
               aGStack_258);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformMatrixValues<3>
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,(GLint)matrixValues[0xf],
               aGStack_258,false);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    matrixValues[0xf] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"mat4Uniform");
    glu::CallLogWrapper::glUniformMatrix4fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)matrixValues[0xf],1,'\0',
               aGStack_258);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformMatrixValues<4>
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,(GLint)matrixValues[0xf],
               aGStack_258,false);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  else {
    glu::operator<<((this->super_ApiCase).m_log,(ShaderProgram *)local_e0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp mat2 mat2Uniform;"
			"uniform highp mat3 mat3Uniform;"
			"uniform highp mat4 mat4Uniform;"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(mat2Uniform[0][0] + mat3Uniform[0][0] + mat4Uniform[0][0]);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		float matrixValues[4 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
		};

		// the values of the matrix are returned in column major order but they can be given in either order

		location = glGetUniformLocation(program.getProgram(), "mat2Uniform");
		glUniformMatrix2fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<2>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		location = glGetUniformLocation(program.getProgram(), "mat3Uniform");
		glUniformMatrix3fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<3>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		location = glGetUniformLocation(program.getProgram(), "mat4Uniform");
		glUniformMatrix4fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<4>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}